

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

void __thiscall
absl::lts_20250127::cord_internal::InlineData::CopyInlineToString
          (InlineData *this,Nonnull<std::string_*> dst)

{
  size_t sVar1;
  
  if (((this->rep_).field_0.data[0] & 1U) == 0) {
    std::__cxx11::string::assign((char *)dst,(ulong)((long)&(this->rep_).field_0 + 1));
    sVar1 = Rep::inline_size(&this->rep_);
    std::__cxx11::string::erase((ulong)dst,sVar1);
    return;
  }
  __assert_fail("!is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x281,
                "void absl::cord_internal::InlineData::CopyInlineToString(absl::Nonnull<std::string *>) const"
               );
}

Assistant:

bool is_tree() const { return (rep_.tag() & 1) != 0; }